

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

void png_calculate_crc(png_structrp png_ptr,png_const_bytep ptr,png_size_t length)

{
  bool bVar1;
  uint local_34;
  ulong uStack_30;
  uInt safe_length;
  uLong crc;
  png_size_t pStack_20;
  int need_crc;
  png_size_t length_local;
  png_const_bytep ptr_local;
  png_structrp png_ptr_local;
  
  if ((png_ptr->chunk_name >> 0x1d & 1) == 0) {
    bVar1 = (png_ptr->flags & 0x800) != 0;
  }
  else {
    bVar1 = (png_ptr->flags & 0x300) == 0x300;
  }
  if ((!bVar1) && (length != 0)) {
    uStack_30 = (ulong)png_ptr->crc;
    pStack_20 = length;
    length_local = (png_size_t)ptr;
    do {
      local_34 = (uint)pStack_20;
      if (local_34 == 0) {
        local_34 = 0xffffffff;
      }
      uStack_30 = crc32(uStack_30,(uchar *)length_local,local_34);
      length_local = length_local + local_34;
      pStack_20 = pStack_20 - local_34;
    } while (pStack_20 != 0);
    png_ptr->crc = (png_uint_32)uStack_30;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_calculate_crc(png_structrp png_ptr, png_const_bytep ptr, png_size_t length)
{
   int need_crc = 1;

   if (PNG_CHUNK_ANCILLARY(png_ptr->chunk_name) != 0)
   {
      if ((png_ptr->flags & PNG_FLAG_CRC_ANCILLARY_MASK) ==
          (PNG_FLAG_CRC_ANCILLARY_USE | PNG_FLAG_CRC_ANCILLARY_NOWARN))
         need_crc = 0;
   }

   else /* critical */
   {
      if ((png_ptr->flags & PNG_FLAG_CRC_CRITICAL_IGNORE) != 0)
         need_crc = 0;
   }

   /* 'uLong' is defined in zlib.h as unsigned long; this means that on some
    * systems it is a 64-bit value.  crc32, however, returns 32 bits so the
    * following cast is safe.  'uInt' may be no more than 16 bits, so it is
    * necessary to perform a loop here.
    */
   if (need_crc != 0 && length > 0)
   {
      uLong crc = png_ptr->crc; /* Should never issue a warning */

      do
      {
         uInt safe_length = (uInt)length;
#ifndef __COVERITY__
         if (safe_length == 0)
            safe_length = (uInt)-1; /* evil, but safe */
#endif

         crc = crc32(crc, ptr, safe_length);

         /* The following should never issue compiler warnings; if they do the
          * target system has characteristics that will probably violate other
          * assumptions within the libpng code.
          */
         ptr += safe_length;
         length -= safe_length;
      }
      while (length > 0);

      /* And the following is always safe because the crc is only 32 bits. */
      png_ptr->crc = (png_uint_32)crc;
   }
}